

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O0

void __thiscall
QGridLayoutRowData::stealBox
          (QGridLayoutRowData *this,int start,int end,int which,qreal *positions,qreal *sizes)

{
  bool bVar1;
  qreal *pqVar2;
  const_reference pdVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  qsizetype in_RDI;
  double *in_R8;
  double *in_R9;
  QGridLayoutBox *box;
  qreal avail;
  int i;
  qreal nextSpacing;
  qreal offset;
  const_reference in_stack_ffffffffffffffb0;
  double local_48;
  int local_3c;
  double local_38;
  double local_30;
  double *local_28;
  double *local_20;
  
  local_30 = 0.0;
  local_38 = 0.0;
  local_28 = in_R9;
  local_20 = in_R8;
  for (local_3c = in_ESI; local_3c < in_EDX; local_3c = local_3c + 1) {
    local_48 = 0.0;
    bVar1 = QBitArray::testBit((QBitArray *)in_stack_ffffffffffffffb0,in_RDI);
    if (!bVar1) {
      in_stack_ffffffffffffffb0 =
           QList<QGridLayoutBox>::at((QList<QGridLayoutBox> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI);
      pqVar2 = QGridLayoutBox::q_sizes(in_stack_ffffffffffffffb0,in_ECX);
      local_48 = *pqVar2;
      local_30 = local_38 + local_30;
      pdVar3 = QList<double>::at((QList<double> *)in_stack_ffffffffffffffb0,in_RDI);
      local_38 = *pdVar3;
    }
    *local_20 = local_30;
    *local_28 = local_48;
    local_30 = local_48 + local_30;
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void QGridLayoutRowData::stealBox(int start, int end, int which, qreal *positions, qreal *sizes)
{
    qreal offset = 0.0;
    qreal nextSpacing = 0.0;

    for (int i = start; i < end; ++i) {
        qreal avail = 0.0;

        if (!ignore.testBit(i)) {
            const QGridLayoutBox &box = boxes.at(i);
            avail = box.q_sizes(which);
            offset += nextSpacing;
            nextSpacing = spacings.at(i);
        }

        *positions++ = offset;
        *sizes++ = avail;
        offset += avail;
    }
}